

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_double
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,double value,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  pointer plVar1;
  write_double f;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sink
  ;
  write_double local_68;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((plVar1[-1].even_odd_ == 0) || (plVar1[-1].state_ == buffer)) {
    local_38.buf_ptr = &this->key_;
    (this->key_)._M_string_length = 0;
    *(this->key_)._M_dataplus._M_p = '\0';
    detail::write_double::write_double(&local_68,general,0);
    detail::write_double::operator()(&local_68,value,&local_38);
    if (local_68.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.to_double_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.to_double_.buffer_.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    plVar1 = (this->level_stack_).
             super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar1[-1].even_odd_ == 0) {
      if (plVar1[-1].state_ == buffer) {
        if (plVar1[-1].count_ != 0) {
          std::__cxx11::string::push_back((char)this + '8');
        }
        std::__cxx11::string::replace
                  ((ulong)&this->key_buffer_,(this->key_buffer_)._M_string_length,(char *)0x0,
                   (ulong)(this->key_)._M_dataplus._M_p);
        std::__cxx11::string::push_back((char)&this->key_buffer_);
      }
      else {
        local_68.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (this->key_)._M_dataplus._M_p;
        local_68.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(this->key_)._M_string_length;
        (*this->destination_->_vptr_basic_json_visitor[9])(this->destination_,&local_68,context,ec);
      }
      goto LAB_001da93b;
    }
    if (plVar1[-1].state_ == buffer) {
      if ((plVar1[-1].type_ != object) && (plVar1[-1].count_ != 0)) {
        std::__cxx11::string::push_back((char)this + '8');
      }
      std::__cxx11::string::replace
                ((ulong)&this->key_buffer_,(this->key_buffer_)._M_string_length,(char *)0x0,
                 (ulong)(this->key_)._M_dataplus._M_p);
      goto LAB_001da93b;
    }
  }
  (*this->destination_->_vptr_basic_json_visitor[0x12])
            (value,this->destination_,(ulong)tag,context,ec);
LAB_001da93b:
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar1[-1].even_odd_ != 0) {
    plVar1[-1].count_ = plVar1[-1].count_ + 1;
  }
  if (plVar1[-1].type_ == object) {
    plVar1[-1].even_odd_ = (uint)(plVar1[-1].even_odd_ == 0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear();
                string_sink<string_type> sink(key_);
                jsoncons::detail::write_double f{float_chars_format::general,0};
                f(value, sink);
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->double_value(value, tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }